

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefParamSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DefParamSyntax,slang::syntax::DefParamSyntax_const&>
          (BumpAllocator *this,DefParamSyntax *args)

{
  DefParamSyntax *this_00;
  
  this_00 = (DefParamSyntax *)allocate(this,0xa8,8);
  slang::syntax::DefParamSyntax::DefParamSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }